

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O2

ssize_t __thiscall
xmrig::DaemonClient::send(DaemonClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Ch *__n_00;
  ssize_t extraout_RAX;
  Stack<rapidjson::CrtAllocator> local_98;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_60;
  
  local_60.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_98;
  local_98.stack_ = (char *)0x0;
  local_98.stackTop_ = (char *)0x0;
  local_98.allocator_ = (CrtAllocator *)0x0;
  local_98.ownAllocator_ = (CrtAllocator *)0x0;
  local_98.stackEnd_ = (char *)0x0;
  local_98.initialCapacity_ = 0x200;
  local_60.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_60.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_60.level_stack_.stackEnd_ = (char *)0x0;
  local_60.level_stack_.stack_ = (char *)0x0;
  local_60.level_stack_.stackTop_ = (char *)0x0;
  local_60.level_stack_.initialCapacity_ = 0x200;
  local_60.maxDecimalPlaces_ = 0x144;
  local_60.hasRoot_ = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)__n,&local_60);
  __n_00 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &local_98);
  send(this,__fd,__buf,(size_t)__n_00,(int)local_98.stackTop_ - (int)local_98.stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_60.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_98);
  return extraout_RAX;
}

Assistant:

void xmrig::DaemonClient::send(int method, const char *url, const rapidjson::Document &doc)
{
    using namespace rapidjson;

    StringBuffer buffer(nullptr, 512);
    Writer<StringBuffer> writer(buffer);
    doc.Accept(writer);

    send(method, url, buffer.GetString(), buffer.GetSize());
}